

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::insert_move_before(xml_node *this,xml_node *moved,xml_node *node)

{
  bool bVar1;
  xml_allocator *this_00;
  xml_document_struct *pxVar2;
  xml_node in_RDX;
  xml_node in_RSI;
  long *in_RDI;
  xml_allocator *alloc;
  xml_node local_8;
  
  bVar1 = impl::anon_unknown_0::allow_move(in_RSI,in_RDX);
  if (bVar1) {
    if (((in_RDX._root)->header == 0) || (*(long *)((in_RDX._root)->header + 0x18) != *in_RDI)) {
      xml_node(&local_8);
    }
    else if ((in_RSI._root)->header == (in_RDX._root)->header) {
      xml_node(&local_8);
    }
    else {
      this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>
                          ((xml_node_struct *)*in_RDI);
      bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
      if (bVar1) {
        pxVar2 = impl::anon_unknown_0::get_document<pugi::xml_node_struct>
                           ((xml_node_struct *)*in_RDI);
        (pxVar2->super_xml_node_struct).header = (pxVar2->super_xml_node_struct).header | 0x40;
        impl::anon_unknown_0::remove_node((xml_node_struct *)(in_RSI._root)->header);
        impl::anon_unknown_0::insert_node_before
                  ((xml_node_struct *)(in_RSI._root)->header,
                   (xml_node_struct *)(in_RDX._root)->header);
        local_8._root = (xml_node_struct *)(in_RSI._root)->header;
      }
      else {
        xml_node(&local_8);
      }
    }
  }
  else {
    xml_node(&local_8);
  }
  return (xml_node)local_8._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::insert_move_before(const xml_node& moved, const xml_node& node)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();
		if (moved._root == node._root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::insert_node_before(moved._root, node._root);

		return moved;
	}